

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_elem_delete(kvtree_elem *elem)

{
  kvtree_elem *local_10;
  kvtree_elem *elem_local;
  
  if (elem != (kvtree_elem *)0x0) {
    local_10 = elem;
    kvtree_free(elem);
    kvtree_delete(&local_10->hash);
    local_10->hash = (kvtree_struct *)0x0;
    kvtree_free(&local_10);
  }
  return 0;
}

Assistant:

static int kvtree_elem_delete(kvtree_elem* elem)
{
  if (elem != NULL) {
    /* free the key which was strdup'ed */
    kvtree_free(&(elem->key));

    /* free the hash */
    kvtree_delete(&elem->hash);
    elem->hash = NULL;

    /* finally, free the element structure itself */
    kvtree_free(&elem);
  }
  return KVTREE_SUCCESS;
}